

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_1da1d1::Db::parseOperatorName(Db *this,NameState *State)

{
  char cVar1;
  int iVar2;
  bool local_81;
  Node *local_60;
  Node *SN_1;
  Node *SN;
  Node *local_48;
  Node *Ty;
  SwapAndRestore<bool> SavePermit;
  SwapAndRestore<bool> SaveTemplate;
  NameState *State_local;
  Db *this_local;
  
  cVar1 = look(this,0);
  switch(cVar1) {
  case 'a':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'N':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator&=");
      break;
    default:
      this_local = (Db *)0x0;
      break;
    case 'S':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator=");
      break;
    case 'a':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator&&");
      break;
    case 'd':
    case 'n':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator&");
    }
    break;
  default:
    this_local = (Db *)0x0;
    break;
  case 'c':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'l':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator()");
      break;
    case 'm':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator,");
      break;
    default:
      this_local = (Db *)0x0;
      break;
    case 'o':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator~");
      break;
    case 'v':
      this->First = this->First + 2;
      SwapAndRestore<bool>::SwapAndRestore
                ((SwapAndRestore<bool> *)&SavePermit.OriginalValue,&this->TryToParseTemplateArgs,
                 false);
      local_81 = (this->PermitForwardTemplateReferences & 1U) != 0 || State != (NameState *)0x0;
      SwapAndRestore<bool>::SwapAndRestore
                ((SwapAndRestore<bool> *)&Ty,&this->PermitForwardTemplateReferences,local_81);
      local_48 = parseType(this);
      if (local_48 == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        if (State != (NameState *)0x0) {
          State->CtorDtorConversion = true;
        }
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::ConversionOperatorType,(anonymous_namespace)::Node*&>
                                     ((Db *)this,&local_48);
      }
      SN._4_4_ = 1;
      SwapAndRestore<bool>::~SwapAndRestore((SwapAndRestore<bool> *)&Ty);
      SwapAndRestore<bool>::~SwapAndRestore((SwapAndRestore<bool> *)&SavePermit.OriginalValue);
    }
    break;
  case 'd':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'V':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator/=");
      break;
    default:
      this_local = (Db *)0x0;
      break;
    case 'a':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[18]>
                                   ((Db *)this,(char (*) [18])"operator delete[]");
      break;
    case 'e':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator*");
      break;
    case 'l':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[16]>
                                   ((Db *)this,(char (*) [16])"operator delete");
      break;
    case 'v':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator/");
    }
    break;
  case 'e':
    cVar1 = look(this,1);
    if (cVar1 == 'O') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator^=");
    }
    else if (cVar1 == 'o') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator^");
    }
    else if (cVar1 == 'q') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator==");
    }
    else {
      this_local = (Db *)0x0;
    }
    break;
  case 'g':
    cVar1 = look(this,1);
    if (cVar1 == 'e') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator>=");
    }
    else if (cVar1 == 't') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator>");
    }
    else {
      this_local = (Db *)0x0;
    }
    break;
  case 'i':
    cVar1 = look(this,1);
    if (cVar1 == 'x') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator[]");
    }
    else {
      this_local = (Db *)0x0;
    }
    break;
  case 'l':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'S':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[12]>
                                   ((Db *)this,(char (*) [12])"operator<<=");
      break;
    default:
      this_local = (Db *)0x0;
      break;
    case 'e':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator<=");
      break;
    case 'i':
      this->First = this->First + 2;
      SN_1 = parseSourceName(this,State);
      if (SN_1 == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::LiteralOperator,(anonymous_namespace)::Node*&>
                                     ((Db *)this,&SN_1);
      }
      break;
    case 's':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator<<");
      break;
    case 't':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator<");
    }
    break;
  case 'm':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'I':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator-=");
      break;
    default:
      this_local = (Db *)0x0;
      break;
    case 'L':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator*=");
      break;
    case 'i':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator-");
      break;
    case 'l':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator*");
      break;
    case 'm':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator--");
    }
    break;
  case 'n':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'a':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[15]>
                                   ((Db *)this,(char (*) [15])"operator new[]");
      break;
    default:
      this_local = (Db *)0x0;
      break;
    case 'e':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator!=");
      break;
    case 'g':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator-");
      break;
    case 't':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator!");
      break;
    case 'w':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[13]>
                                   ((Db *)this,(char (*) [13])"operator new");
    }
    break;
  case 'o':
    cVar1 = look(this,1);
    if (cVar1 == 'R') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator|=");
    }
    else if (cVar1 == 'o') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator||");
    }
    else if (cVar1 == 'r') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator|");
    }
    else {
      this_local = (Db *)0x0;
    }
    break;
  case 'p':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'L':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator+=");
      break;
    default:
      this_local = (Db *)0x0;
      break;
    case 'l':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator+");
      break;
    case 'm':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[12]>
                                   ((Db *)this,(char (*) [12])"operator->*");
      break;
    case 'p':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator++");
      break;
    case 's':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator+");
      break;
    case 't':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator->");
    }
    break;
  case 'q':
    cVar1 = look(this,1);
    if (cVar1 == 'u') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator?");
    }
    else {
      this_local = (Db *)0x0;
    }
    break;
  case 'r':
    cVar1 = look(this,1);
    switch(cVar1) {
    case 'M':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator%=");
      break;
    default:
      this_local = (Db *)0x0;
      break;
    case 'S':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[12]>
                                   ((Db *)this,(char (*) [12])"operator>>=");
      break;
    case 'm':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[10]>
                                   ((Db *)this,(char (*) [10])"operator%");
      break;
    case 's':
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[11]>
                                   ((Db *)this,(char (*) [11])"operator>>");
    }
    break;
  case 's':
    cVar1 = look(this,1);
    if (cVar1 == 's') {
      this->First = this->First + 2;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameType,char_const(&)[12]>
                                   ((Db *)this,(char (*) [12])"operator<=>");
    }
    else {
      this_local = (Db *)0x0;
    }
    break;
  case 'v':
    cVar1 = look(this,1);
    iVar2 = isdigit((int)cVar1);
    if (iVar2 == 0) {
      this_local = (Db *)0x0;
    }
    else {
      this->First = this->First + 2;
      local_60 = parseSourceName(this,State);
      if (local_60 == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::ConversionOperatorType,(anonymous_namespace)::Node*&>
                                     ((Db *)this,&local_60);
      }
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseOperatorName(NameState *State) {
  switch (look()) {
  case 'a':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator&&");
    case 'd':
    case 'n':
      First += 2;
      return make<NameType>("operator&");
    case 'N':
      First += 2;
      return make<NameType>("operator&=");
    case 'S':
      First += 2;
      return make<NameType>("operator=");
    }
    return nullptr;
  case 'c':
    switch (look(1)) {
    case 'l':
      First += 2;
      return make<NameType>("operator()");
    case 'm':
      First += 2;
      return make<NameType>("operator,");
    case 'o':
      First += 2;
      return make<NameType>("operator~");
    //                   ::= cv <type>    # (cast)
    case 'v': {
      First += 2;
      SwapAndRestore<bool> SaveTemplate(TryToParseTemplateArgs, false);
      // If we're parsing an encoding, State != nullptr and the conversion
      // operators' <type> could have a <template-param> that refers to some
      // <template-arg>s further ahead in the mangled name.
      SwapAndRestore<bool> SavePermit(PermitForwardTemplateReferences,
                                      PermitForwardTemplateReferences ||
                                          State != nullptr);
      Node* Ty = parseType();
      if (Ty == nullptr)
        return nullptr;
      if (State) State->CtorDtorConversion = true;
      return make<ConversionOperatorType>(Ty);
    }
    }
    return nullptr;
  case 'd':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator delete[]");
    case 'e':
      First += 2;
      return make<NameType>("operator*");
    case 'l':
      First += 2;
      return make<NameType>("operator delete");
    case 'v':
      First += 2;
      return make<NameType>("operator/");
    case 'V':
      First += 2;
      return make<NameType>("operator/=");
    }
    return nullptr;
  case 'e':
    switch (look(1)) {
    case 'o':
      First += 2;
      return make<NameType>("operator^");
    case 'O':
      First += 2;
      return make<NameType>("operator^=");
    case 'q':
      First += 2;
      return make<NameType>("operator==");
    }
    return nullptr;
  case 'g':
    switch (look(1)) {
    case 'e':
      First += 2;
      return make<NameType>("operator>=");
    case 't':
      First += 2;
      return make<NameType>("operator>");
    }
    return nullptr;
  case 'i':
    if (look(1) == 'x') {
      First += 2;
      return make<NameType>("operator[]");
    }
    return nullptr;
  case 'l':
    switch (look(1)) {
    case 'e':
      First += 2;
      return make<NameType>("operator<=");
    //                   ::= li <source-name>  # operator ""
    case 'i': {
      First += 2;
      Node *SN = parseSourceName(State);
      if (SN == nullptr)
        return nullptr;
      return make<LiteralOperator>(SN);
    }
    case 's':
      First += 2;
      return make<NameType>("operator<<");
    case 'S':
      First += 2;
      return make<NameType>("operator<<=");
    case 't':
      First += 2;
      return make<NameType>("operator<");
    }
    return nullptr;
  case 'm':
    switch (look(1)) {
    case 'i':
      First += 2;
      return make<NameType>("operator-");
    case 'I':
      First += 2;
      return make<NameType>("operator-=");
    case 'l':
      First += 2;
      return make<NameType>("operator*");
    case 'L':
      First += 2;
      return make<NameType>("operator*=");
    case 'm':
      First += 2;
      return make<NameType>("operator--");
    }
    return nullptr;
  case 'n':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator new[]");
    case 'e':
      First += 2;
      return make<NameType>("operator!=");
    case 'g':
      First += 2;
      return make<NameType>("operator-");
    case 't':
      First += 2;
      return make<NameType>("operator!");
    case 'w':
      First += 2;
      return make<NameType>("operator new");
    }
    return nullptr;
  case 'o':
    switch (look(1)) {
    case 'o':
      First += 2;
      return make<NameType>("operator||");
    case 'r':
      First += 2;
      return make<NameType>("operator|");
    case 'R':
      First += 2;
      return make<NameType>("operator|=");
    }
    return nullptr;
  case 'p':
    switch (look(1)) {
    case 'm':
      First += 2;
      return make<NameType>("operator->*");
    case 'l':
      First += 2;
      return make<NameType>("operator+");
    case 'L':
      First += 2;
      return make<NameType>("operator+=");
    case 'p':
      First += 2;
      return make<NameType>("operator++");
    case 's':
      First += 2;
      return make<NameType>("operator+");
    case 't':
      First += 2;
      return make<NameType>("operator->");
    }
    return nullptr;
  case 'q':
    if (look(1) == 'u') {
      First += 2;
      return make<NameType>("operator?");
    }
    return nullptr;
  case 'r':
    switch (look(1)) {
    case 'm':
      First += 2;
      return make<NameType>("operator%");
    case 'M':
      First += 2;
      return make<NameType>("operator%=");
    case 's':
      First += 2;
      return make<NameType>("operator>>");
    case 'S':
      First += 2;
      return make<NameType>("operator>>=");
    }
    return nullptr;
  case 's':
    if (look(1) == 's') {
      First += 2;
      return make<NameType>("operator<=>");
    }
    return nullptr;
  // ::= v <digit> <source-name>        # vendor extended operator
  case 'v':
    if (std::isdigit(look(1))) {
      First += 2;
      Node *SN = parseSourceName(State);
      if (SN == nullptr)
        return nullptr;
      return make<ConversionOperatorType>(SN);
    }
    return nullptr;
  }
  return nullptr;
}